

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

LIBSSH2_PUBLICKEY * libssh2_publickey_init(LIBSSH2_SESSION *session)

{
  LIBSSH2_PUBLICKEY **ppLVar1;
  uchar **data;
  size_t *data_len;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  time_t start_time;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_PUBLICKEY *pLVar6;
  ssize_t sVar7;
  size_t buflen;
  ulong uVar8;
  uchar *puVar9;
  char *pcVar10;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  start_time = time((time_t *)0x0);
  ppLVar1 = &session->pkeyInit_pkey;
  local_50 = session->pkeyInit_buffer;
  local_38 = session->pkeyInit_buffer + 4;
  local_40 = session->pkeyInit_buffer + 8;
  local_48 = session->pkeyInit_buffer + 0xf;
  data = &session->pkeyInit_data;
  data_len = &session->pkeyInit_data_len;
LAB_0011e400:
  switch(session->pkeyInit_state) {
  case libssh2_NB_state_idle:
    break;
  case libssh2_NB_state_allocated:
    goto switchD_0011e41e_caseD_1;
  default:
    goto switchD_0011e41e_caseD_2;
  case libssh2_NB_state_sent:
    channel = session->pkeyInit_channel;
    goto LAB_0011e497;
  case libssh2_NB_state_sent1:
    goto switchD_0011e41e_caseD_4;
  case libssh2_NB_state_sent2:
    buflen = 0x13 - session->pkeyInit_buffer_sent;
    puVar9 = local_50;
    goto LAB_0011e5c8;
  case libssh2_NB_state_sent3:
    goto switchD_0011e41e_caseD_6;
  }
  *ppLVar1 = (LIBSSH2_PUBLICKEY *)0x0;
  session->pkeyInit_channel = (LIBSSH2_CHANNEL *)0x0;
  session->pkeyInit_data = (uchar *)0x0;
  session->pkeyInit_state = libssh2_NB_state_allocated;
switchD_0011e41e_caseD_1:
  channel = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->pkeyInit_channel = channel;
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    session->pkeyInit_state = libssh2_NB_state_sent;
LAB_0011e497:
    iVar5 = _libssh2_channel_process_startup(channel,"subsystem",9,"publickey",9);
    if (iVar5 == 0) {
      session->pkeyInit_state = libssh2_NB_state_sent1;
switchD_0011e41e_caseD_4:
      iVar5 = _libssh2_channel_extended_data(session->pkeyInit_channel,1);
      if (iVar5 == -0x25) goto LAB_0011e517;
      pLVar6 = (LIBSSH2_PUBLICKEY *)_libssh2_calloc(session,0x80);
      puVar9 = local_50;
      session->pkeyInit_pkey = pLVar6;
      if (pLVar6 != (LIBSSH2_PUBLICKEY *)0x0) {
        pLVar6->channel = session->pkeyInit_channel;
        pLVar6->version = 0;
        _libssh2_htonu32(local_50,0xf);
        _libssh2_htonu32(local_38,7);
        builtin_memcpy(local_40,"version",7);
        _libssh2_htonu32(local_48,2);
        session->pkeyInit_buffer_sent = 0;
        session->pkeyInit_state = libssh2_NB_state_sent2;
        buflen = 0x13;
LAB_0011e5c8:
        sVar7 = _libssh2_channel_write(session->pkeyInit_channel,0,puVar9,buflen);
        if (sVar7 == -0x25) {
          pcVar10 = "Would block sending publickey version packet";
        }
        else {
          if (sVar7 < 0) {
            iVar5 = (int)sVar7;
            pcVar10 = "Unable to send publickey version packet";
            goto LAB_0011e76a;
          }
          uVar8 = session->pkeyInit_buffer_sent + sVar7;
          session->pkeyInit_buffer_sent = uVar8;
          if (0x12 < uVar8) {
            session->pkeyInit_state = libssh2_NB_state_sent3;
switchD_0011e41e_caseD_6:
            iVar5 = publickey_packet_receive(*ppLVar1,data,data_len);
            if (iVar5 != 0) goto LAB_0011e6c6;
            local_58 = *data;
            iVar5 = publickey_response_id(&local_58,*data_len);
            puVar9 = local_58;
            if (iVar5 < 0) {
              iVar5 = -0x24;
              pcVar10 = "Invalid publickey subsystem response code";
              goto LAB_0011e76a;
            }
            if (3 < *data_len) {
              if (iVar5 == 1) {
                uVar2 = _libssh2_ntohu32(local_58);
                if (1 < uVar2) {
                  uVar2 = 2;
                }
                session->pkeyInit_pkey->version = uVar2;
                (*session->free)(session->pkeyInit_data,&session->abstract);
                session->pkeyInit_data = (uchar *)0x0;
                session->pkeyInit_state = libssh2_NB_state_idle;
                pLVar6 = session->pkeyInit_pkey;
                goto LAB_0011e7e5;
              }
              if (iVar5 != 0) {
                _libssh2_error(session,-0x24,"Unexpected publickey subsystem response, ignoring");
                (*session->free)(session->pkeyInit_data,&session->abstract);
                session->pkeyInit_data = (uchar *)0x0;
                goto switchD_0011e41e_caseD_6;
              }
              if (*data_len < 8) goto LAB_0011e75b;
              uVar2 = _libssh2_ntohu32(local_58);
              uVar3 = _libssh2_ntohu32(puVar9 + 4);
              if ((puVar9 + (ulong)uVar3 + 0xc <= *data + *data_len) &&
                 (uVar4 = _libssh2_ntohu32(puVar9 + (ulong)uVar3 + 8),
                 puVar9 + (ulong)uVar3 + 0xc + uVar4 <= *data + *data_len)) {
                pcVar10 = "unknown";
                if (uVar2 < 9) {
                  pcVar10 = publickey_status_codes[uVar2].name;
                }
                iVar5 = -0x24;
                goto LAB_0011e76a;
              }
            }
LAB_0011e75b:
            iVar5 = -0x26;
            pcVar10 = "Public key init data too small";
            goto LAB_0011e76a;
          }
          pcVar10 = "Need to be called again to complete this";
        }
        goto LAB_0011e79e;
      }
      iVar5 = -6;
      pcVar10 = "Unable to allocate a new publickey structure";
      goto LAB_0011e76a;
    }
    if (iVar5 != -0x25) {
      iVar5 = -0x15;
      pcVar10 = "Unable to request publickey subsystem";
      goto LAB_0011e76a;
    }
LAB_0011e517:
    pcVar10 = "Would block starting publickey subsystem";
    goto LAB_0011e79e;
  }
  iVar5 = libssh2_session_last_errno(session);
  if (iVar5 != -0x25) {
    iVar5 = -0x15;
    pcVar10 = "Unable to startup channel";
    goto LAB_0011e76a;
  }
  goto LAB_0011e7e3;
LAB_0011e6c6:
  if (iVar5 == -0x25) {
    pcVar10 = "Would block waiting for response from publickey subsystem";
  }
  else {
    iVar5 = -0x1e;
    pcVar10 = "Timeout waiting for response from publickey subsystem";
LAB_0011e76a:
    _libssh2_error(session,iVar5,pcVar10);
switchD_0011e41e_caseD_2:
    session->pkeyInit_state = libssh2_NB_state_sent4;
    if ((session->pkeyInit_channel == (LIBSSH2_CHANNEL *)0x0) ||
       (iVar5 = _libssh2_channel_close(session->pkeyInit_channel), iVar5 != -0x25)) {
      if (*ppLVar1 != (LIBSSH2_PUBLICKEY *)0x0) {
        (*session->free)(*ppLVar1,&session->abstract);
        session->pkeyInit_pkey = (LIBSSH2_PUBLICKEY *)0x0;
      }
      if (*data != (uchar *)0x0) {
        (*session->free)(*data,&session->abstract);
        session->pkeyInit_data = (uchar *)0x0;
      }
      session->pkeyInit_state = libssh2_NB_state_idle;
      goto LAB_0011e7e3;
    }
    pcVar10 = "Would block closing channel";
  }
LAB_0011e79e:
  _libssh2_error(session,-0x25,pcVar10);
LAB_0011e7e3:
  pLVar6 = (LIBSSH2_PUBLICKEY *)0x0;
LAB_0011e7e5:
  if (session->api_block_mode == 0) {
    return pLVar6;
  }
  if (pLVar6 != (LIBSSH2_PUBLICKEY *)0x0) {
    return pLVar6;
  }
  iVar5 = libssh2_session_last_errno(session);
  if ((iVar5 != -0x25) || (iVar5 = _libssh2_wait_socket(session,start_time), iVar5 != 0)) {
    return (LIBSSH2_PUBLICKEY *)0x0;
  }
  goto LAB_0011e400;
}

Assistant:

static LIBSSH2_PUBLICKEY *publickey_init(LIBSSH2_SESSION *session)
{
    int response;
    int rc;

    if(session->pkeyInit_state == libssh2_NB_state_idle) {
        session->pkeyInit_data = NULL;
        session->pkeyInit_pkey = NULL;
        session->pkeyInit_channel = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Initializing publickey subsystem"));

        session->pkeyInit_state = libssh2_NB_state_allocated;
    }

    if(session->pkeyInit_state == libssh2_NB_state_allocated) {

        session->pkeyInit_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->pkeyInit_channel) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN)
                /* The error state is already set, so leave it */
                return NULL;
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to startup channel");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_process_startup(session->pkeyInit_channel,
                                              "subsystem",
                                              sizeof("subsystem") - 1,
                                              "publickey",
                                              sizeof("publickey") - 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to request publickey subsystem");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent1;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent1) {
        unsigned char *s;
        rc = _libssh2_channel_extended_data(session->pkeyInit_channel,
                                         LIBSSH2_CHANNEL_EXTENDED_DATA_IGNORE);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }

        session->pkeyInit_pkey =
            LIBSSH2_CALLOC(session, sizeof(LIBSSH2_PUBLICKEY));
        if(!session->pkeyInit_pkey) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a new publickey structure");
            goto err_exit;
        }
        session->pkeyInit_pkey->channel = session->pkeyInit_channel;
        session->pkeyInit_pkey->version = 0;

        s = session->pkeyInit_buffer;
        _libssh2_htonu32(s, 4 + (sizeof("version") - 1) + 4);
        s += 4;
        _libssh2_htonu32(s, sizeof("version") - 1);
        s += 4;
        memcpy(s, "version", sizeof("version") - 1);
        s += sizeof("version") - 1;
        _libssh2_htonu32(s, LIBSSH2_PUBLICKEY_VERSION);

        session->pkeyInit_buffer_sent = 0;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey advertising version %d support",
                       (int) LIBSSH2_PUBLICKEY_VERSION));

        session->pkeyInit_state = libssh2_NB_state_sent2;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent2) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(session->pkeyInit_channel, 0,
                                          session->pkeyInit_buffer,
                                          19 - session->pkeyInit_buffer_sent);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending publickey version packet");
            return NULL;
        }
        else if(nwritten < 0) {
            _libssh2_error(session, (int)nwritten,
                           "Unable to send publickey version packet");
            goto err_exit;
        }
        session->pkeyInit_buffer_sent += nwritten;
        if(session->pkeyInit_buffer_sent < 19) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Need to be called again to complete this");
            return NULL;
        }

        session->pkeyInit_state = libssh2_NB_state_sent3;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent3) {
        for(;;) {
            unsigned char *s;
            rc = publickey_packet_receive(session->pkeyInit_pkey,
                                          &session->pkeyInit_data,
                                          &session->pkeyInit_data_len);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response from "
                               "publickey subsystem");
                return NULL;
            }
            else if(rc) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                               "Timeout waiting for response from "
                               "publickey subsystem");
                goto err_exit;
            }

            s = session->pkeyInit_data;
            if((response =
                 publickey_response_id(&s, session->pkeyInit_data_len)) < 0) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Invalid publickey subsystem response code");
                goto err_exit;
            }

            if(session->pkeyInit_data_len < 4) {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "Public key init data too small");
                goto err_exit;
            }

            switch(response) {
            case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
                /* Error */
            {
                unsigned long status, descr_len, lang_len;

                if(session->pkeyInit_data_len >= 8) {
                    status = _libssh2_ntohu32(s);
                    s += 4;
                    descr_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + descr_len + 4 <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* description starts here */
                    s += descr_len;
                    lang_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + lang_len <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* lang starts here */
                    s += lang_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s >
                    session->pkeyInit_data + session->pkeyInit_data_len) {
                    _libssh2_error(session,
                                   LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                   "Malformed publickey subsystem packet");
                    goto err_exit;
                }

                publickey_status_error(NULL, session, status);

                goto err_exit;
            }

            case LIBSSH2_PUBLICKEY_RESPONSE_VERSION:
                /* What we want */
                session->pkeyInit_pkey->version = _libssh2_ntohu32(s);
                if(session->pkeyInit_pkey->version >
                    LIBSSH2_PUBLICKEY_VERSION) {
                    _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                                   "Truncate remote publickey version "
                                   "from %lu",
                                   session->pkeyInit_pkey->version));
                    session->pkeyInit_pkey->version =
                        LIBSSH2_PUBLICKEY_VERSION;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                               "Enabling publickey subsystem version %lu",
                               session->pkeyInit_pkey->version));
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
                session->pkeyInit_state = libssh2_NB_state_idle;
                return session->pkeyInit_pkey;

            default:
                /* Unknown/Unexpected */
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Unexpected publickey subsystem response, "
                               "ignoring");
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
            }
        }
    }

    /* Never reached except by direct goto */
err_exit:
    session->pkeyInit_state = libssh2_NB_state_sent4;
    if(session->pkeyInit_channel) {
        rc = _libssh2_channel_close(session->pkeyInit_channel);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block closing channel");
            return NULL;
        }
    }
    if(session->pkeyInit_pkey) {
        LIBSSH2_FREE(session, session->pkeyInit_pkey);
        session->pkeyInit_pkey = NULL;
    }
    if(session->pkeyInit_data) {
        LIBSSH2_FREE(session, session->pkeyInit_data);
        session->pkeyInit_data = NULL;
    }
    session->pkeyInit_state = libssh2_NB_state_idle;
    return NULL;
}